

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void prescan_quantize(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows
                     )

{
  short sVar1;
  JDIMENSION JVar2;
  _func_void_j_decompress_ptr *p_Var3;
  ulong uVar4;
  short sVar5;
  ulong uVar6;
  byte *pbVar7;
  JDIMENSION JVar8;
  long lVar9;
  bool bVar10;
  
  p_Var3 = cinfo->cquantize[1].finish_pass;
  JVar2 = cinfo->output_width;
  uVar6 = 0;
  uVar4 = (ulong)(uint)num_rows;
  if (num_rows < 1) {
    uVar4 = uVar6;
  }
  for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
    pbVar7 = input_buf[uVar6];
    JVar8 = JVar2;
    while (bVar10 = JVar8 != 0, JVar8 = JVar8 - 1, bVar10) {
      lVar9 = (ulong)((pbVar7[1] & 0xffffffc) << 4) + *(long *)(p_Var3 + (*pbVar7 & 0xfffffff8));
      sVar1 = *(short *)(lVar9 + (ulong)(pbVar7[2] >> 3) * 2);
      sVar5 = sVar1 + 1;
      if (sVar5 == 0) {
        sVar5 = sVar1;
      }
      *(short *)(lVar9 + (ulong)(pbVar7[2] >> 3) * 2) = sVar5;
      pbVar7 = pbVar7 + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
prescan_quantize (j_decompress_ptr cinfo, JSAMPARRAY input_buf,
		  JSAMPARRAY output_buf, int num_rows)
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  register JSAMPROW ptr;
  register histptr histp;
  register hist3d histogram = cquantize->histogram;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    ptr = input_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the histogram */
      histp = & histogram[GETJSAMPLE(ptr[0]) >> C0_SHIFT]
			 [GETJSAMPLE(ptr[1]) >> C1_SHIFT]
			 [GETJSAMPLE(ptr[2]) >> C2_SHIFT];
      /* increment, check for overflow and undo increment if so. */
      if (++(*histp) <= 0)
	(*histp)--;
      ptr += 3;
    }
  }
}